

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

Element * __thiscall
Rml::ElementDocument::FindNextNavigationElement
          (ElementDocument *this,Element *current_element,NavigationSearchDirection direction,
          Property *property)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  Box *this_00;
  bool local_171;
  bool local_166;
  uint local_164;
  char *local_158;
  uint local_12c;
  char *local_120;
  undefined1 local_100 [8];
  SearchNavigationResult best_result;
  Element *start_element;
  anon_class_8_1_8991fb9c GetNearestScrollContainer;
  Vector2<float> local_d4;
  undefined1 local_cc [8];
  BoundingBox bounding_box;
  Vector2f position;
  bool direction_is_forward;
  bool direction_is_vertical;
  bool direction_is_horizontal;
  Element *result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_88 [8];
  String id;
  undefined1 local_58 [8];
  String value;
  PropertySource *source;
  Property *property_local;
  NavigationSearchDirection direction_local;
  Element *current_element_local;
  ElementDocument *this_local;
  
  if (property->unit == KEYWORD) {
    local_166 = Down < direction;
    uVar1 = Variant::Get<int>(&property->value,0);
    switch(uVar1 & 0xff) {
    case 0:
      return (Element *)0x0;
    case 1:
      break;
    case 2:
      if (direction != Left && direction != Right) {
        return (Element *)0x0;
      }
      break;
    case 3:
      if (local_166) {
        return (Element *)0x0;
      }
    }
    if ((ElementDocument *)current_element == this) {
      local_171 = direction == Down || direction == Right;
      this_local = (ElementDocument *)FindNextTabElement(this,&this->super_Element,local_171);
    }
    else {
      bounding_box.max = Element::GetAbsoluteOffset(current_element,Border);
      this_00 = Element::GetBox(current_element);
      register0x00001200 = Box::GetSize(this_00,Border);
      local_d4 = Vector2<float>::operator+(&bounding_box.max,register0x00001200);
      anon_unknown_0::BoundingBox::BoundingBox((BoundingBox *)local_cc,&bounding_box.max,&local_d4);
      start_element = &this->super_Element;
      best_result._8_8_ =
           FindNextNavigationElement::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&start_element,current_element);
      anon_unknown_0::SearchNavigationResult::SearchNavigationResult
                ((SearchNavigationResult *)local_100);
      anon_unknown_0::SearchNavigationTarget
                ((SearchNavigationResult *)local_100,(Element *)best_result._8_8_,direction,
                 (BoundingBox *)local_cc,current_element);
      this_local = (ElementDocument *)local_100;
    }
  }
  else if (property->unit == STRING) {
    value.field_2._8_8_ =
         ::std::__shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>::get
                   (&(property->source).
                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>);
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               property);
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_58);
    if (*pcVar2 == '#') {
      local_98._M_current = (char *)::std::__cxx11::string::begin();
      local_90 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_98,1);
      local_a0._M_current = (char *)::std::__cxx11::string::end();
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)local_88,local_90,local_a0,(allocator<char> *)((long)&result + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      this_local = (ElementDocument *)
                   Element::GetElementById(&this->super_Element,(String *)local_88);
      if (this_local == (ElementDocument *)0x0) {
        uVar3 = ::std::__cxx11::string::c_str();
        if (value.field_2._8_8_ == 0) {
          local_158 = "";
        }
        else {
          local_158 = (char *)::std::__cxx11::string::c_str();
        }
        if (value.field_2._8_8_ == 0) {
          local_164 = 0xffffffff;
        }
        else {
          local_164 = *(uint *)(value.field_2._8_8_ + 0x20);
        }
        Log::Message(LT_WARNING,
                     "Trying to navigate to element with id \'%s\', but could not find element. Declared at %s:%d"
                     ,uVar3,local_158,(ulong)local_164);
      }
      id.field_2._8_4_ = 1;
      ::std::__cxx11::string::~string((string *)local_88);
    }
    else {
      uVar3 = ::std::__cxx11::string::c_str();
      if (value.field_2._8_8_ == 0) {
        local_120 = "";
      }
      else {
        local_120 = (char *)::std::__cxx11::string::c_str();
      }
      if (value.field_2._8_8_ == 0) {
        local_12c = 0xffffffff;
      }
      else {
        local_12c = *(uint *)(value.field_2._8_8_ + 0x20);
      }
      Log::Message(LT_WARNING,
                   "Invalid navigation value \'%s\': Expected a keyword or a string with an element id prefixed with \'#\'. Declared at %s:%d"
                   ,uVar3,local_120,(ulong)local_12c);
      this_local = (ElementDocument *)0x0;
      id.field_2._8_4_ = 1;
    }
    ::std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_local = (ElementDocument *)0x0;
  }
  return &this_local->super_Element;
}

Assistant:

Element* ElementDocument::FindNextNavigationElement(Element* current_element, NavigationSearchDirection direction, const Property& property)
{
	switch (property.unit)
	{
	case Unit::STRING:
	{
		const PropertySource* source = property.source.get();
		const String value = property.Get<String>();
		if (value[0] != '#')
		{
			Log::Message(Log::LT_WARNING,
				"Invalid navigation value '%s': Expected a keyword or a string with an element id prefixed with '#'. Declared at %s:%d",
				value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
			return nullptr;
		}

		const String id = String(value.begin() + 1, value.end());
		Element* result = GetElementById(id);
		if (!result)
		{
			Log::Message(Log::LT_WARNING, "Trying to navigate to element with id '%s', but could not find element. Declared at %s:%d", id.c_str(),
				source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		return result;
	}
	break;
	case Unit::KEYWORD:
	{
		const bool direction_is_horizontal = (direction == NavigationSearchDirection::Left || direction == NavigationSearchDirection::Right);
		const bool direction_is_vertical = (direction == NavigationSearchDirection::Up || direction == NavigationSearchDirection::Down);
		switch (static_cast<Style::Nav>(property.value.Get<int>()))
		{
		case Style::Nav::None: return nullptr;
		case Style::Nav::Auto: break;
		case Style::Nav::Horizontal:
			if (!direction_is_horizontal)
				return nullptr;
			break;
		case Style::Nav::Vertical:
			if (!direction_is_vertical)
				return nullptr;
			break;
		}
	}
	break;
	default: return nullptr;
	}

	if (current_element == this)
	{
		const bool direction_is_forward = (direction == NavigationSearchDirection::Down || direction == NavigationSearchDirection::Right);
		return FindNextTabElement(this, direction_is_forward);
	}

	const Vector2f position = current_element->GetAbsoluteOffset(BoxArea::Border);
	const BoundingBox bounding_box = {position, position + current_element->GetBox().GetSize(BoxArea::Border)};

	auto GetNearestScrollContainer = [this](Element* element) -> Element* {
		for (element = element->GetParentNode(); element; element = element->GetParentNode())
		{
			if (IsScrollContainer(element))
				return element;
		}
		return this;
	};
	Element* start_element = GetNearestScrollContainer(current_element);

	SearchNavigationResult best_result;
	SearchNavigationTarget(best_result, start_element, direction, bounding_box, current_element);
	return best_result.element;
}